

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void webrtc::StoreAsComplex(float *data,float (*data_complex) [65])

{
  long lVar1;
  
  (*data_complex)[0] = *data;
  data_complex[1][0] = 0.0;
  lVar1 = 0;
  do {
    (*data_complex)[lVar1 + 1] = data[lVar1 * 2 + 2];
    data_complex[1][lVar1 + 1] = data[lVar1 * 2 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3f);
  (*data_complex)[0x40] = data[1];
  data_complex[1][0x40] = 0.0;
  return;
}

Assistant:

__inline static void StoreAsComplex(const float* data,
                                    float data_complex[2][PART_LEN1]) {
  int i;
  data_complex[0][0] = data[0];
  data_complex[1][0] = 0;
  for (i = 1; i < PART_LEN; i++) {
    data_complex[0][i] = data[2 * i];
    data_complex[1][i] = data[2 * i + 1];
  }
  data_complex[0][PART_LEN] = data[1];
  data_complex[1][PART_LEN] = 0;
}